

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

SortNode * __thiscall GLDrawList::DoSort(GLDrawList *this,SortNode *head)

{
  GLDrawItemType GVar1;
  SortNode *pSVar2;
  SortNode *pSVar3;
  
  pSVar2 = FindSortPlane(this,head);
  if (pSVar2 == (SortNode *)0x0) {
    pSVar2 = FindSortWall(this,head);
    if (pSVar2 == (SortNode *)0x0) {
      pSVar2 = SortSpriteList(this,head);
      return pSVar2;
    }
    if (pSVar2 == head) {
      head = head->next;
    }
    SortNode::UnlinkFromChain(pSVar2);
    while (pSVar3 = head, pSVar3 != (SortNode *)0x0) {
      head = pSVar3->next;
      GVar1 = (this->drawitems).Array[pSVar3->itemindex].rendertype;
      if (GVar1 == GLDIT_SPRITE) {
        SortSpriteIntoWall(this,pSVar2,pSVar3);
      }
      else if (GVar1 == GLDIT_WALL) {
        SortWallIntoWall(this,pSVar2,pSVar3);
      }
    }
  }
  else {
    if (pSVar2 == head) {
      head = head->next;
    }
    SortNode::UnlinkFromChain(pSVar2);
    while (pSVar3 = head, pSVar3 != (SortNode *)0x0) {
      head = pSVar3->next;
      GVar1 = (this->drawitems).Array[pSVar3->itemindex].rendertype;
      if (GVar1 == GLDIT_WALL) {
        SortWallIntoPlane(this,pSVar2,pSVar3);
      }
      else if (GVar1 == GLDIT_SPRITE) {
        SortSpriteIntoPlane(this,pSVar2,pSVar3);
      }
      else if (GVar1 == GLDIT_FLAT) {
        SortPlaneIntoPlane(this,pSVar2,pSVar3);
      }
    }
  }
  if (pSVar2->left != (SortNode *)0x0) {
    pSVar3 = DoSort(this,pSVar2->left);
    pSVar2->left = pSVar3;
  }
  if (pSVar2->right != (SortNode *)0x0) {
    pSVar3 = DoSort(this,pSVar2->right);
    pSVar2->right = pSVar3;
  }
  return pSVar2;
}

Assistant:

SortNode * GLDrawList::DoSort(SortNode * head)
{
	SortNode * node, * sn, * next;

	sn=FindSortPlane(head);
	if (sn)
	{
		if (sn==head) head=head->next;
		sn->UnlinkFromChain();
		node=head;
		head=sn;
		while (node)
		{
			next=node->next;
			switch(drawitems[node->itemindex].rendertype)
			{
			case GLDIT_FLAT:
				SortPlaneIntoPlane(head,node);
				break;

			case GLDIT_WALL:
				SortWallIntoPlane(head,node);
				break;

			case GLDIT_SPRITE:
				SortSpriteIntoPlane(head,node);
				break;
			}
			node=next;
		}
	}
	else
	{
		sn=FindSortWall(head);
		if (sn)
		{
			if (sn==head) head=head->next;
			sn->UnlinkFromChain();
			node=head;
			head=sn;
			while (node)
			{
				next=node->next;
				switch(drawitems[node->itemindex].rendertype)
				{
				case GLDIT_WALL:
					SortWallIntoWall(head,node);
					break;

				case GLDIT_SPRITE:
					SortSpriteIntoWall(head,node);
					break;

				case GLDIT_FLAT: break;
				}
				node=next;
			}
		}
		else 
		{
			return SortSpriteList(head);
		}
	}
	if (head->left) head->left=DoSort(head->left);
	if (head->right) head->right=DoSort(head->right);
	return sn;
}